

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O3

void __thiscall
CumulativeCalProp::ttef_analyse_tasks
          (CumulativeCalProp *this,int begin,int end,
          list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *tasks,
          int *en_lift,vec<Lit> *expl)

{
  size_t *psVar1;
  uint task;
  bool bVar2;
  vec<Lit> *this_00;
  ulong uVar3;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *plVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  _List_node_base *p_Var9;
  Lit LVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  IntVar *pIVar16;
  int dur_in_lb;
  int dur_in_ub;
  Lit local_80;
  uint local_7c;
  uint local_78;
  int local_74;
  vec<Lit> *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int *local_58;
  ulong local_50;
  long local_48;
  IntVar *local_40;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *local_38;
  
  p_Var9 = (tasks->
           super__List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)tasks) {
    local_48 = (long)begin;
    local_7c = begin;
    local_78 = end;
    local_70 = expl;
    local_58 = en_lift;
    local_38 = tasks;
    do {
      uVar14 = local_78;
      uVar7 = local_7c;
      task = (uint)*(size_t *)(p_Var9 + 1);
      local_50 = (ulong)task;
      iVar5 = *(int *)((long)(p_Var9 + 1) + 4);
      pIVar16 = (this->start).data[local_50];
      iVar8 = pIVar16->min0;
      iVar15 = pIVar16->max0;
      if (this->ttef_expl_deg == ED_LIFT) {
        local_80.x = 0;
        local_74 = 0;
        local_64 = *local_58;
        local_68 = ((this->usage).data[local_50]->min).v;
        iVar12 = local_64 / local_68;
        local_60 = iVar8;
        local_5c = iVar15;
        local_40 = pIVar16;
        uVar6 = ttef_analyse_tasks_left_shift(this,local_7c,local_78,iVar5,task,iVar12,&local_80.x);
        iVar8 = local_60;
        uVar7 = ttef_analyse_tasks_right_shift(this,uVar7,uVar14,iVar5,task,iVar12,&local_74);
        LVar10.x = local_80.x;
        if (local_74 < local_80.x) {
          LVar10.x = local_74;
        }
        *local_58 = (LVar10.x - iVar5) * local_68 + local_64;
        pIVar16 = local_40;
        iVar15 = local_5c;
      }
      else if (this->ttef_expl_deg == ED_NORMAL) {
        if (this->rho == 1) {
          lVar11 = (long)(this->taskCalendar).data[local_50];
          iVar5 = (this->workingPeriods[lVar11 + -1][(int)(iVar5 + local_7c)] -
                  this->workingPeriods[lVar11 + -1][local_48]) + ((this->dur).data[local_50]->min).v
          ;
          if (0 < iVar5 && 0 < (int)local_7c) {
            iVar12 = 0;
            uVar14 = local_7c;
            do {
              iVar12 = (uint)(this->calendar[lVar11 + -1][(ulong)uVar14 - 1] == 1) + iVar12;
              uVar7 = uVar14 - 1;
              if (iVar5 <= iVar12) break;
              bVar2 = 1 < uVar14;
              uVar14 = uVar7;
            } while (bVar2);
          }
          uVar6 = this->est_2[(int)task];
          if ((int)uVar7 < this->est_2[(int)task]) {
            uVar6 = uVar7;
          }
          uVar7 = this->lst_2[(int)task];
        }
        else {
          iVar12 = ((this->dur).data[local_50]->min).v;
          if (iVar5 < iVar12 && 0 < (int)local_7c) {
            iVar13 = 0;
            uVar14 = local_7c;
            do {
              iVar13 = (uint)(this->calendar[(long)(this->taskCalendar).data[local_50] + -1]
                              [(ulong)uVar14 - 1] == 1) + iVar13;
              uVar7 = uVar14 - 1;
              if (iVar12 - iVar5 <= iVar13) break;
              bVar2 = 1 < uVar14;
              uVar14 = uVar7;
            } while (bVar2);
          }
          uVar6 = this->est_2[(int)task];
          if ((int)uVar7 < this->est_2[(int)task]) {
            uVar6 = uVar7;
          }
          uVar7 = local_78;
          if (0 < iVar5 && 0 < (int)local_78) {
            iVar12 = 0;
            uVar14 = local_78;
            do {
              iVar12 = (uint)(this->calendar[(long)(this->taskCalendar).data[local_50] + -1]
                              [(ulong)uVar14 - 1] == 1) + iVar12;
              uVar7 = uVar14 - 1;
              if (iVar5 <= iVar12) break;
              bVar2 = 1 < uVar14;
              uVar14 = uVar7;
            } while (bVar2);
          }
          if ((int)uVar7 < this->lst_2[(int)task]) {
            uVar7 = this->lst_2[(int)task];
          }
        }
      }
      else {
        uVar6 = this->est_2[(int)task];
        uVar7 = this->lst_2[(int)task];
      }
      this_00 = local_70;
      if (iVar8 < (int)uVar6) {
        iVar5 = (*(pIVar16->super_Var).super_Branching._vptr_Branching[3])(pIVar16);
        if (iVar5 == 3) {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[8])(pIVar16);
        }
        else {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[0xd])
                                 (pIVar16,(long)(int)(uVar6 - 1),3);
        }
        vec<Lit>::push(this_00,&local_80);
      }
      uVar3 = local_50;
      if ((int)uVar7 < iVar15) {
        pIVar16 = (this->start).data[local_50];
        iVar5 = (*(pIVar16->super_Var).super_Branching._vptr_Branching[3])(pIVar16);
        if (iVar5 == 3) {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[9])(pIVar16);
        }
        else {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[0xd])
                                 (pIVar16,(long)(int)(uVar7 + 1),2);
        }
        vec<Lit>::push(this_00,&local_80);
      }
      pIVar16 = (this->dur).data[uVar3];
      iVar5 = (pIVar16->min).v;
      if (pIVar16->min0 < iVar5) {
        iVar8 = (*(pIVar16->super_Var).super_Branching._vptr_Branching[3])(pIVar16);
        if (iVar8 == 3) {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[8])(pIVar16);
        }
        else {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[0xd])
                                 (pIVar16,(long)iVar5 + -1,3);
        }
        vec<Lit>::push(this_00,&local_80);
      }
      pIVar16 = (this->usage).data[uVar3];
      iVar5 = (pIVar16->min).v;
      if (pIVar16->min0 < iVar5) {
        iVar8 = (*(pIVar16->super_Var).super_Branching._vptr_Branching[3])(pIVar16);
        if (iVar8 == 3) {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[8])(pIVar16);
        }
        else {
          local_80.x = (*(pIVar16->super_Var).super_Branching._vptr_Branching[0xd])
                                 (pIVar16,(long)iVar5 + -1,3);
        }
        vec<Lit>::push(this_00,&local_80);
      }
      plVar4 = local_38;
      p_Var9 = (local_38->
               super__List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      psVar1 = &(local_38->
                super__List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var9);
      p_Var9 = (plVar4->
               super__List_base<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var9 != (_List_node_base *)plVar4);
  }
  return;
}

Assistant:

void CumulativeCalProp::ttef_analyse_tasks(const int begin, const int end,
																					 std::list<TaskDur>& tasks, int& en_lift,
																					 vec<Lit>& expl) {
	while (!tasks.empty()) {
		const int i = tasks.front().task;
		const int dur_in = tasks.front().dur_in;
		int expl_lb;
		int expl_ub;
		const int est0 = min_start0(i);
		const int lst0 = max_start0(i);
		// TTEF_cal: running variable for loops t, storages for execution times sto1 and sto2
		int t;
		int sto1;
		int sto2;
		// Calculate possible lifting
		// TTEF_cal: several changes were necessary
		switch (ttef_expl_deg) {
			case ED_NORMAL:
				// XXX Is min_dur correct
				if (rho == 1) {
					// Resource stays engaged
					sto1 = workingPeriods[taskCalendar[i] - 1][begin] -
								 workingPeriods[taskCalendar[i] - 1][begin + dur_in];
					sto2 = min_dur(i) - sto1;
					sto1 = 0;
					t = begin;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_lb = std::min(est_2[i], t);
					expl_ub = lst_2[i];  // max(lst_2[i], end - dur_in);
				} else {
					// Resource is released
					sto1 = 0;
					sto2 = min_dur(i) - dur_in;
					t = begin;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_lb = std::min(est_2[i], t);
					sto1 = 0;
					sto2 = dur_in;
					t = end;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_ub = std::max(lst_2[i], t);
				}
				// expl_lb = begin + dur_in - min_dur(i); expl_ub = end - dur_in;
				break;
			//-----------------------------------------------------------
			case ED_LIFT: {
				int dur_in_lb = 0;
				int dur_in_ub = 0;
				// Computing maximal lift for the work days inside the time window [begin, end)
				const int max_lift = en_lift / min_usage(i);
				// Computing the lifted lower and upper bound on the start time
				expl_lb = ttef_analyse_tasks_left_shift(begin, end, dur_in, i, max_lift, dur_in_lb);
				expl_ub = ttef_analyse_tasks_right_shift(begin, end, dur_in, i, max_lift, dur_in_ub);
				// Some consistency checks
				assert(dur_in - dur_in_lb <= max_lift);
				assert(dur_in - dur_in_ub <= max_lift);
				assert(ttef_analyse_tasks_check_expl_lb(begin, end, i, std::min(dur_in_lb, dur_in_ub),
																								expl_lb));
				assert(ttef_analyse_tasks_check_expl_ub(begin, end, i, std::min(dur_in_lb, dur_in_ub),
																								expl_ub));
				// Computing the used lift
				const int dur_lift = dur_in - std::min(dur_in_lb, dur_in_ub);
				// Updating the remaining energy for lifting
				en_lift -= min_usage(i) * dur_lift;
			} break;
			//-----------------------------------------------------------
			case ED_NAIVE:
			default:
				expl_lb = est_2[i];
				expl_ub = lst_2[i];
		}
		// printf("%d: dur_in %d/%d; en_in %d; est0 %d; lst0 %d\t", i, dur_in, dur[i], dur_in *
		// min_usage(i), est0, lst0);
		if (est0 < expl_lb) {
			// printf("s[%d] >= %d; ", i, expl_lb);
			expl.push(getNegGeqLit(start[i], expl_lb));
		}
		if (expl_ub < lst0) {
			// printf("s[%d] <= %d; ", i, expl_ub);
			expl.push(getNegLeqLit(start[i], expl_ub));
		}
		// Get the negated literal for [[dur[i] >= min_dur(i)]]
		if (min_dur0(i) < min_dur(i)) {
			expl.push(getNegGeqLit(dur[i], min_dur(i)));
		}
		// Get the negated literal for [[usage[i] >= min_usage(i)]]
		if (min_usage0(i) < min_usage(i)) {
			expl.push(getNegGeqLit(usage[i], min_usage(i)));
		}
		// printf("\n");
		tasks.pop_front();
	}
}